

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::FlushMoveState::FlushMoveState(FlushMoveState *this,TupleDataCollection *collection_p)

{
  TupleDataCollection *this_00;
  TupleDataLayout *pTVar1;
  pointer pLVar2;
  pointer pLVar3;
  vector<unsigned_long,_true> column_ids;
  unsigned_long local_b8;
  DataChunk *local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  Vector *local_88;
  Vector *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  this->collection = collection_p;
  *(undefined1 (*) [16])
   &(this->scan_state).pin_state.row_handles.handles.
    super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
    .
    super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
    ._M_impl.super__Vector_impl_data = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->scan_state).pin_state.row_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->scan_state).pin_state.heap_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 8) = (undefined1  [16])0x0;
  (this->scan_state).pin_state.properties = INVALID;
  TupleDataChunkState::TupleDataChunkState(&(this->scan_state).chunk_state);
  *(undefined4 *)&(this->scan_state).segment_index = 0xffffffff;
  *(undefined4 *)((long)&(this->scan_state).segment_index + 4) = 0xffffffff;
  *(undefined4 *)&(this->scan_state).chunk_index = 0xffffffff;
  *(undefined4 *)((long)&(this->scan_state).chunk_index + 4) = 0xffffffff;
  local_b0 = &this->groups;
  DataChunk::DataChunk(local_b0);
  LogicalType::LogicalType(&local_48,UBIGINT);
  Vector::Vector(&this->hashes,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  local_80 = &this->hashes;
  LogicalType::LogicalType(&local_60,POINTER);
  Vector::Vector(&this->group_addresses,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  local_88 = &this->group_addresses;
  SelectionVector::SelectionVector(&this->new_groups_sel,0x800);
  pTVar1 = TupleDataCollection::GetLayout(this->collection);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&local_a8,
             ((long)(pTVar1->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pTVar1->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1);
  local_b8 = 0;
  pLVar2 = (pTVar1->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (pTVar1->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pLVar3 - (long)pLVar2 != 0x18) {
    do {
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_b8);
        pLVar2 = (pTVar1->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar3 = (pTVar1->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_b8;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 < ((long)pLVar3 - (long)pLVar2 >> 3) * -0x5555555555555555 - 1U);
  }
  this_00 = this->collection;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,&local_a8);
  TupleDataCollection::InitializeScan
            (this_00,&this->scan_state,(vector<unsigned_long,_true> *)&local_78,DESTROY_AFTER_DONE);
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  TupleDataCollection::InitializeScanChunk(this->collection,&this->scan_state,local_b0);
  this->hash_col_idx =
       ((long)(pTVar1->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pTVar1->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1;
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

explicit FlushMoveState(TupleDataCollection &collection_p)
	    : collection(collection_p), hashes(LogicalType::HASH), group_addresses(LogicalType::POINTER),
	      new_groups_sel(STANDARD_VECTOR_SIZE) {
		const auto &layout = collection.GetLayout();
		vector<column_t> column_ids;
		column_ids.reserve(layout.ColumnCount() - 1);
		for (idx_t col_idx = 0; col_idx < layout.ColumnCount() - 1; col_idx++) {
			column_ids.emplace_back(col_idx);
		}
		collection.InitializeScan(scan_state, column_ids, TupleDataPinProperties::DESTROY_AFTER_DONE);
		collection.InitializeScanChunk(scan_state, groups);
		hash_col_idx = layout.ColumnCount() - 1;
	}